

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_xml.hpp
# Opt level: O2

ptree * lattice::operator>>(ptree *pt,graph *lat)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  double dVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int tp;
  long lVar10;
  invalid_argument *piVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  size_t m;
  pointer pcVar14;
  pointer pcVar15;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  long local_1d0;
  coordinate_t pos;
  istringstream is;
  
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((path_type *)&is,"<xmlattr>.dimension",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&str,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                   *)pt,(path_type *)&is);
  std::__cxx11::string::~string((string *)&is);
  if (str.super_type.m_initialized == true) {
    iVar8 = std::__cxx11::stoi((string *)&str.super_type.m_storage,(size_t *)0x0,10);
    pcVar15 = (pointer)(long)iVar8;
  }
  else {
    pcVar15 = (pointer)0x0;
  }
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&str.super_type);
  _is = pcVar15;
  graph::operator=(lat,(graph *)&is);
  graph::~graph((graph *)&is);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((path_type *)&is,"<xmlattr>.vertices",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&str,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                   *)pt,(path_type *)&is);
  std::__cxx11::string::~string((string *)&is);
  if (str.super_type.m_initialized == true) {
    iVar8 = std::__cxx11::stoi((string *)&str.super_type.m_storage,(size_t *)0x0,10);
    local_1d0 = (long)iVar8;
  }
  else {
    local_1d0 = 0;
  }
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&str.super_type);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)pt->m_children + 8);
  sVar2 = pbVar1[3]._M_string_length;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar2 - 0x60);
  if (sVar2 == 0) {
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  while (pbVar13 != pbVar1) {
    bVar6 = std::operator==(pbVar13,"VERTEX");
    if (bVar6) {
      _is = pcVar15;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pos,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&is);
      if (lat->dim_ != 0) {
        pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pbVar13[2]._M_dataplus._M_p + 8);
        bVar6 = false;
        pbVar12 = pbVar3;
        while( true ) {
          pbVar5 = pbVar12 + 3;
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pbVar5->_M_string_length - 0x60);
          if (pbVar5->_M_string_length == 0) {
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          if (pbVar12 == pbVar3) break;
          bVar7 = std::operator==(pbVar12,"COORDINATE");
          if (bVar7) {
            if (bVar6) {
              piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar11,"duplicated <COORDINATE> tag");
              __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&is,(string *)(pbVar12 + 1),_S_in);
            str.super_type._0_8_ = (long)&str.super_type.m_storage.dummy_ + 8;
            str.super_type.m_storage.dummy_.aligner_ = (type)0x0;
            str.super_type.m_storage.dummy_.data[8] = '\0';
            for (pcVar14 = (pointer)0x0; pcVar15 != pcVar14; pcVar14 = pcVar14 + 1) {
              std::operator>>((istream *)&is,(string *)&str.super_type);
              dVar4 = std::__cxx11::stod((string *)&str.super_type,(size_t *)0x0);
              pos.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [(long)pcVar14] = dVar4;
            }
            std::__cxx11::string::~string((string *)&str.super_type);
            std::__cxx11::istringstream::~istringstream((istringstream *)&is);
            bVar6 = true;
          }
        }
      }
      boost::property_tree::
      string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::string_path((path_type *)&is,"<xmlattr>.type",0x2e);
      boost::property_tree::
      basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
      get_optional<std::__cxx11::string>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&str.super_type,
                 (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                  *)(pbVar13 + 1),(path_type *)&is);
      std::__cxx11::string::~string((string *)&is);
      iVar8 = 0;
      if (str.super_type.m_initialized == true) {
        iVar8 = std::__cxx11::stoi((string *)&str.super_type.m_storage,(size_t *)0x0,10);
      }
      boost::optional_detail::
      optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional_base(&str.super_type);
      graph::add_site(lat,&pos,iVar8);
      free(pos.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    pbVar12 = pbVar13 + 3;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pbVar12->_M_string_length - 0x60);
    if (pbVar12->_M_string_length == 0) {
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  lVar10 = (long)(lat->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(lat->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar10 == 0) {
    _is = pcVar15;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&str,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&is);
    while (bVar6 = local_1d0 != 0, local_1d0 = local_1d0 + -1, bVar6) {
      graph::add_site(lat,(coordinate_t *)&str,0);
    }
    free((void *)str.super_type._0_8_);
  }
  else if ((local_1d0 != 0) && (lVar10 / 0x38 != local_1d0)) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar11,"inconsistent number of sites");
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)pt->m_children + 8);
  sVar2 = pbVar1[3]._M_string_length;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar2 - 0x60);
  if (sVar2 == 0) {
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  do {
    if (pbVar13 == pbVar1) {
      return pt;
    }
    bVar6 = std::operator==(pbVar13,"EDGE");
    if (bVar6) {
      pbVar12 = pbVar13 + 1;
      boost::property_tree::
      string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::string_path((path_type *)&is,"<xmlattr>.source",0x2e);
      boost::property_tree::
      basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
      get_optional<std::__cxx11::string>
                (&str,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)pbVar12,(path_type *)&is);
      std::__cxx11::string::~string((string *)&is);
      if (str.super_type.m_initialized != true) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar11,"source attribute not found");
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar8 = std::__cxx11::stoi((string *)&str.super_type.m_storage,(size_t *)0x0,10);
      boost::optional_detail::
      optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional_base(&str.super_type);
      boost::property_tree::
      string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::string_path((path_type *)&is,"<xmlattr>.target",0x2e);
      boost::property_tree::
      basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
      get_optional<std::__cxx11::string>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&str.super_type,
                 (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                  *)pbVar12,(path_type *)&is);
      std::__cxx11::string::~string((string *)&is);
      if (str.super_type.m_initialized != true) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar11,"target attribute not found");
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar9 = std::__cxx11::stoi((string *)&str.super_type.m_storage,(size_t *)0x0,10);
      boost::optional_detail::
      optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional_base(&str.super_type);
      boost::property_tree::
      string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::string_path((path_type *)&is,"<xmlattr>.type",0x2e);
      boost::property_tree::
      basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
      get_optional<std::__cxx11::string>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&str.super_type,
                 (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                  *)pbVar12,(path_type *)&is);
      std::__cxx11::string::~string((string *)&is);
      tp = 0;
      if (str.super_type.m_initialized == true) {
        tp = std::__cxx11::stoi((string *)&str.super_type.m_storage,(size_t *)0x0,10);
      }
      boost::optional_detail::
      optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional_base(&str.super_type);
      graph::add_bond(lat,(long)iVar8 - 1,(long)iVar9 - 1,tp);
    }
    pbVar12 = pbVar13 + 3;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pbVar12->_M_string_length - 0x60);
    if (pbVar12->_M_string_length == 0) {
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  } while( true );
}

Assistant:

inline ptree& operator>>(ptree& pt, graph& lat) {
  std::size_t dim = 0;
  if (auto str = pt.get_optional<std::string>("<xmlattr>.dimension")) {
    dim = stoi(str.get());
  }
  lat = graph(dim);

  std::size_t ns = 0;
  if (auto str = pt.get_optional<std::string>("<xmlattr>.vertices")) ns = stoi(str.get());

  for (auto& v : pt) {
    if (v.first == "VERTEX") {
      bool found_pos = false;
      coordinate_t pos = coordinate_t::Zero(dim);
      int tp = 0;
      if (lat.dimension() > 0) {
        for (auto& c : v.second) {
          if (c.first == "COORDINATE") {
            if (found_pos) throw std::invalid_argument("duplicated <COORDINATE> tag");
            std::istringstream is(c.second.data());
            std::string sin;
            for (std::size_t m = 0; m < dim; ++m) {
              is >> sin;
              pos(m) = stod(sin);
            }
            found_pos = true;
          }
        }
      }
      if (auto str = v.second.get_optional<std::string>("<xmlattr>.type")) tp = stoi(str.get());
      lat.add_site(pos, tp);
    }
  }
     
  if (lat.num_sites() > 0) {
    if (ns > 0 && lat.num_sites() != ns)
      throw std::invalid_argument("inconsistent number of sites");
  } else {
    coordinate_t pos = coordinate_t::Zero(dim);
    for (std::size_t i = 0; i < ns; ++i) lat.add_site(pos, 0);
  }
  
  for (auto& e : pt) {
    if (e.first == "EDGE") {
      std::size_t source, target; // offset one
      int tp = 0;
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.source")) {
        source = stoi(str.get());
      } else {
        throw std::invalid_argument("source attribute not found");
      }
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.target")) {
        target = stoi(str.get());
      } else {
        throw std::invalid_argument("target attribute not found");
      }
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.type")) tp = stoi(str.get());
      lat.add_bond(source - 1, target - 1, tp);
    }
  }
  return pt;
}